

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O3

void JitFFI::SysV64::create_return_copy(JitFuncCallerCreater *jfcc,uint size)

{
  JitFuncCreater *pJVar1;
  size_t in_RCX;
  uint local_1c;
  
  pJVar1 = (jfcc->super_JitFuncCallerCreaterX64).data;
  JitFuncCreater::push(pJVar1,'H');
  JitFuncCreater::push(pJVar1,0x89);
  JitFuncCreater::push(pJVar1,0xe6);
  pJVar1 = (jfcc->super_JitFuncCallerCreaterX64).data;
  JitFuncCreater::push(pJVar1,'H');
  JitFuncCreater::push(pJVar1,0x89);
  JitFuncCreater::push(pJVar1,0xdf);
  pJVar1 = (jfcc->super_JitFuncCallerCreaterX64).data;
  JitFuncCreater::push(pJVar1,0xb9);
  local_1c = size;
  JitFuncCreater::write(pJVar1,(int)&local_1c,(void *)0x4,in_RCX);
  pJVar1 = (jfcc->super_JitFuncCallerCreaterX64).data;
  JitFuncCreater::push(pJVar1,0xf3);
  JitFuncCreater::push(pJVar1,0xa4);
  return;
}

Assistant:

static void create_return_copy(JitFuncCallerCreater &jfcc, unsigned int size) {
			mov(jfcc.data, rsi, rsp);
			mov(jfcc.data, rdi, rbx);
			movd_u32(jfcc.data, ecx, size);
			movsb_prdi_prsi_rep(jfcc.data);
		}